

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void free_parser(vw *all)

{
  size_type sVar1;
  long in_RDI;
  io_buf *output;
  v_array<substring> *in_stack_fffffffffffffff0;
  v_array<unsigned_long> *this;
  
  v_array<substring>::delete_v(in_stack_fffffffffffffff0);
  v_array<substring>::delete_v(in_stack_fffffffffffffff0);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x6b8));
  if (sVar1 != 0) {
    v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)in_stack_fffffffffffffff0);
  }
  this = *(v_array<unsigned_long> **)(*(long *)(in_RDI + 8) + 0x208);
  if (this != (v_array<unsigned_long> *)0x0) {
    v_array<char>::delete_v((v_array<char> *)this);
    v_array<char>::delete_v((v_array<char> *)this);
  }
  v_array<unsigned_long>::delete_v(this);
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  all.p->counts.delete_v();
}